

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuronTest.cpp
# Opt level: O3

void __thiscall
Neuron_testApplyInTime_Test::~Neuron_testApplyInTime_Test(Neuron_testApplyInTime_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Neuron, testApplyInTime)
{
    std::ofstream fn, fns;
    fn.open("testApply.csv");
    fns.open("testApply.txt");

    Neuron n(10, 1, 50);

    for (int t = 0; t < 1000; ++t) {
        float mem = n.mem();
        fn << t << "; " << mem << "; " << std::endl;
        fns << ">" << t << " U=" << mem << " I="<< n.syn() << std::endl;

        bool fired = n.tick(TIME_STEP);
        if (fired)
            fns << "\t\t\t****** spike\n";

        if (t == 10)
            n.apply(50);

        if (t == 48)
            EXPECT_TRUE(n.mem() > 0);

        if (t == 49)
            EXPECT_TRUE(fired);

        if (t == 100)
            EXPECT_FALSE(n.apply(80));

        if (t == 200)
            EXPECT_TRUE(n.apply(50));

        if (t == 230)
            EXPECT_TRUE(n.apply(-50));

        if (t == 260)
            EXPECT_TRUE(n.apply(-50));

        if (t == 340)
            EXPECT_TRUE(n.apply(10));

        if (t == 400)
            EXPECT_TRUE(n.apply(160));

        if (t == 460)
            EXPECT_FALSE(n.apply(160));

        if (t >=50 && t < 414)
            EXPECT_FALSE(fired);

        if (t == 580)
            EXPECT_TRUE(n.apply(50));

        if (t > 650)
            EXPECT_FALSE(fired);
    }
}